

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall google::protobuf::Message::PrintDebugString(Message *this)

{
  string local_30;
  
  DebugString_abi_cxx11_(&local_30,this);
  printf("%s",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Message::PrintDebugString() const { printf("%s", DebugString().c_str()); }